

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_short_writes.c
# Opt level: O2

void test_short_writes(void)

{
  int i;
  long lVar1;
  checker *pcVar2;
  size_t in_RCX;
  char *pcVar3;
  uint16_t test_data [16384];
  
  for (lVar1 = 0; lVar1 != 0x4000; lVar1 = lVar1 + 1) {
    test_data[lVar1] = (uint16_t)lVar1;
  }
  pcVar2 = checker_new(1);
  checker_add_file(pcVar2,(char *)test_data,(char *)0x400,in_RCX);
  checker_close(pcVar2);
  pcVar3 = "checker->shortbuf_len > 1024";
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_short_writes.c"
                   ,L'Ã',(uint)(0x400 < pcVar2->shortbuf_len),"checker->shortbuf_len > 1024",
                   (void *)0x0);
  checker_check(pcVar2);
  checker_free(pcVar2);
  pcVar2 = checker_new(1);
  checker_add_file(pcVar2,(char *)test_data,(char *)0x5400,(size_t)pcVar3);
  checker_close(pcVar2);
  pcVar3 = "checker->shortbuf_len > 21 * 1024";
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_short_writes.c"
                   ,L'Î',(uint)(0x5400 < pcVar2->shortbuf_len),"checker->shortbuf_len > 21 * 1024",
                   (void *)0x0);
  checker_check(pcVar2);
  checker_free(pcVar2);
  pcVar2 = checker_new(0);
  checker_add_file(pcVar2,(char *)test_data,(char *)0x400,(size_t)pcVar3);
  checker_close(pcVar2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_short_writes.c"
                   ,L'×',(uint)(0x400 < pcVar2->shortbuf_len),"checker->shortbuf_len > 1024",
                   (void *)0x0);
  checker_check(pcVar2);
  checker_free(pcVar2);
  return;
}

Assistant:

DEFINE_TEST(test_short_writes)
{
        struct checker *checker;
        uint16_t test_data[16384];
        int i;

        for (i = 0; i < 16384; i++)
                test_data[i] = i;


        /* Write a file smaller than the default buffer size (10 * 1024);
         * this will be written out at close.
         */
        checker = checker_new(1);
        checker_add_file(checker, "a", (char *)test_data, 1024);
        checker_close(checker);
        assert(checker->shortbuf_len > 1024);
        checker_check(checker);
        checker_free(checker);

        /* Write a file larger larger than twice default buffer size (10 * 1024);
         * this both fills the buffer and writes it out, and also exercises
         * the "write out full blocks directly" code path.
         */
        checker = checker_new(1);
        checker_add_file(checker, "a", (char *)test_data, 21 * 1024);
        checker_close(checker);
        assert(checker->shortbuf_len > 21 * 1024);
        checker_check(checker);
        checker_free(checker);

        /* Test unbuffered writes - a different code path.
         */
        checker = checker_new(0);
        checker_add_file(checker, "a", (char *)test_data, 1024);
        checker_close(checker);
        assert(checker->shortbuf_len > 1024);
        checker_check(checker);
        checker_free(checker);
}